

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_abstracttx_controller.cpp
# Opt level: O0

void __thiscall
AbstractTransactionController_EnableLockTimeTest_Test::TestBody
          (AbstractTransactionController_EnableLockTimeTest_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  char *pcVar3;
  char *rhs;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TestTransactionController txc;
  uint32_t lock_time;
  string expect_tx_hex;
  TestTransactionController *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar4;
  uint32_t in_stack_fffffffffffffefc;
  TestTransactionController *in_stack_ffffffffffffff00;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  AssertHelper local_b8;
  Message local_b0;
  undefined4 local_a4;
  AssertionResult local_a0;
  AssertHelper local_90;
  Message local_88;
  string local_80 [32];
  AssertionResult local_60 [2];
  undefined4 local_40;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"02000000000090000000",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  local_40 = 0x90;
  TestTransactionController::TestTransactionController
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_60,"txc.GetHex().c_str()","expect_tx_hex.c_str()",pcVar3,rhs);
  std::__cxx11::string::~string(local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_60);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x17ece8);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_abstracttx_controller.cpp"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x17ed45);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17ed9a);
  uVar2 = cfd::AbstractTransactionController::GetDefaultSequence();
  local_a4 = uVar2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(uVar2,in_stack_fffffffffffffef8),in_stack_fffffffffffffef0,
             (uint *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (uint *)in_stack_fffffffffffffee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef8);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    in_stack_fffffffffffffef0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x17ee4a);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_abstracttx_controller.cpp"
               ,0x2f,in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message((Message *)0x17ee98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17eee7);
  local_cc = cfd::AbstractTransactionController::GetLockTimeDisabledSequence();
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(uVar2,uVar4),in_stack_fffffffffffffef0,
             (uint *)CONCAT44(local_cc,in_stack_fffffffffffffee8),(uint *)in_stack_fffffffffffffee0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    in_stack_fffffffffffffee0 =
         (TestTransactionController *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17ef80);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_abstracttx_controller.cpp"
               ,0x31,(char *)in_stack_fffffffffffffee0);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message((Message *)0x17efce);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17f01a);
  TestTransactionController::~TestTransactionController(in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(AbstractTransactionController, EnableLockTimeTest) {
  const std::string expect_tx_hex = "02000000000090000000";
  const uint32_t lock_time = 144;
  TestTransactionController txc = TestTransactionController(lock_time);
  EXPECT_STREQ(txc.GetHex().c_str(), expect_tx_hex.c_str());
  EXPECT_EQ(txc.GetDefaultSequence(), expect_absttx_enablelt_sequence_num);
  EXPECT_EQ(txc.GetLockTimeDisabledSequence(),
      expect_absttx_default_sequence_num);
}